

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O2

void FENToHash(char *fen,string *move_s)

{
  char fen_char;
  int iVar1;
  UINT64 UVar2;
  BookHashNode *pBVar3;
  BookHashNode *pBVar4;
  int iVar5;
  undefined8 uVar6;
  ulong uVar7;
  uint uVar8;
  undefined4 uVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  Movement MVar13;
  int piece_id_array [14];
  string local_50;
  
  piece_id_array[8] = 0x21;
  piece_id_array[9] = 0x23;
  piece_id_array[10] = 0x25;
  piece_id_array[0xb] = 0x27;
  piece_id_array[4] = 0x17;
  piece_id_array[5] = 0x19;
  piece_id_array[6] = 0x1b;
  piece_id_array[7] = 0x20;
  piece_id_array[0] = 0x10;
  piece_id_array[1] = 0x11;
  piece_id_array[2] = 0x13;
  piece_id_array[3] = 0x15;
  piece_id_array[0xc] = 0x29;
  piece_id_array[0xd] = 0x2b;
  pcVar12 = fen + 1;
  iVar11 = 3;
  uVar10 = 3;
  do {
    fen_char = pcVar12[-1];
    if (fen_char == '/') {
      iVar11 = iVar11 + 1;
      uVar10 = 3;
    }
    else {
      if (fen_char == ' ') break;
      if ((byte)(fen_char - 0x31U) < 9) {
        uVar10 = uVar10 + (byte)(fen_char - 0x30);
      }
      else {
        iVar5 = PieceOfFen(fen_char);
        iVar1 = piece_id_array[iVar5];
        uVar8 = iVar11 << 4 | uVar10;
        BookZobristKey = BookZobristKey ^ ZobristTable[iVar1][(int)uVar8];
        BookZobristKeyCheck = BookZobristKeyCheck ^ ZobristTableCheck[iVar1][(int)uVar8];
        piece_id_array[iVar5] = iVar1 + 1;
        uVar10 = uVar10 + 1;
      }
    }
    pcVar12 = pcVar12 + 1;
  } while( true );
  uVar7 = BookZobristKey;
  if (*pcVar12 == 'w') {
    uVar7 = BookZobristKey ^ ZobristPlayer;
    BookZobristKeyCheck = BookZobristKeyCheck ^ ZobristPlayerCheck;
    BookZobristKey = uVar7;
  }
  do {
    uVar10 = (uint)uVar7 & 0xfffff;
    UVar2 = BookHashTable[uVar10].check;
    if (UVar2 == 0) break;
    uVar7 = (ulong)(uVar10 + 1);
  } while (UVar2 != BookZobristKeyCheck);
  if (UVar2 == 0) {
    BookHashTable[uVar10].check = BookZobristKeyCheck;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)move_s);
    MVar13 = StrToMovement(&local_50);
    pBVar4 = BookHashTable;
    uVar9 = MVar13._8_4_;
    uVar6 = MVar13._0_8_;
    pBVar3 = BookHashTable + uVar10;
    (pBVar3->move).from = (char)uVar6;
    (pBVar3->move).to = (char)((ulong)uVar6 >> 8);
    (pBVar3->move).capture = (char)((ulong)uVar6 >> 0x10);
    (pBVar3->move).field_0x3 = (char)((ulong)uVar6 >> 0x18);
    (pBVar3->move).value = (int)((ulong)uVar6 >> 0x20);
    pBVar4 = pBVar4 + uVar10;
    (pBVar4->move).catc = (char)uVar9;
    (pBVar4->move).movec = (char)((uint)uVar9 >> 8);
    *(short *)&(pBVar4->move).field_0xa = (short)((uint)uVar9 >> 0x10);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void FENToHash(const char* fen, string move_s){
    const char *p = fen;
    int piece_id_array[14] = {16, 17, 19, 21, 23, 25, 27, 32, 33, 35, 37, 39, 41, 43};
    int col = GetCol(BOARD_FIRST_POSITION), row = GetRow(BOARD_FIRST_POSITION), piece_id_index, piece_id;

    while(*p != ' '){
        if(*p == '/'){
            col = 3;
            row ++;
        }
        else if(*p > '0' && *p <= '9'){
            int no_piece = *p - '0';
            col += no_piece;
        }
        else{
            piece_id_index = PieceOfFen(*p);
            piece_id = piece_id_array[piece_id_index];
            BookZobristKey ^= ZobristTable[piece_id][GetPosition(col, row)];
            BookZobristKeyCheck ^= ZobristTableCheck[piece_id][GetPosition(col, row)];

            piece_id_array[piece_id_index] ++;
            col ++;
        }
        p ++;
    }
    p ++;   // *p = side
    if(*p == 'w'){
        BookZobristKey ^= ZobristPlayer;
        BookZobristKeyCheck ^= ZobristPlayerCheck;
    }

    UINT32 place;
    place = BookZobristKey & BOOK_HASHTABLE_MASK;
    while(BookHashTable[place].check && BookHashTable[place].check != BookZobristKeyCheck)  // 存着不同的局面，遇到冲突，线性探测再散列
        place = (place + 1) & BOOK_HASHTABLE_MASK;

    if(!BookHashTable[place].check){                            // 位置为空，存入哈希表
        BookHashTable[place].check = BookZobristKeyCheck;
        BookHashTable[place].move = StrToMovement(move_s.substr(0, 4));
    }
}